

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O3

void __thiscall
Fixpp::Field<Fixpp::TagT<308U,_Fixpp::Type::String>_>::Field
          (Field<Fixpp::TagT<308U,_Fixpp::Type::String>_> *this,
          Field<Fixpp::TagT<308U,_Fixpp::Type::String>_> *other)

{
  bool bVar1;
  
  (this->val_)._M_dataplus._M_p = (pointer)&(this->val_).field_2;
  (this->val_)._M_string_length = 0;
  (this->val_).field_2._M_local_buf[0] = '\0';
  this->empty_ = false;
  bVar1 = other->empty_;
  if (bVar1 == false) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->val_,&other->val_);
    bVar1 = other->empty_;
  }
  this->empty_ = bVar1;
  return;
}

Assistant:

Field(const Field& other)
        {
            operator=(other);
        }